

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

bool __thiscall QPDFObjectHandle::isImage(QPDFObjectHandle *this,bool exclude_imagemask)

{
  bool bVar1;
  bool bVar2;
  allocator<char> local_dc;
  allocator<char> local_db;
  allocator<char> local_da;
  allocator<char> local_d9;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_d9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"/Image",&local_da);
  bVar1 = isStreamOfType(this,&local_38,&local_58);
  if (exclude_imagemask && bVar1) {
    getDict((QPDFObjectHandle *)local_b8);
    std::__cxx11::string::string<std::allocator<char>>(local_78,"/ImageMask",&local_db);
    getKey((QPDFObjectHandle *)(local_b8 + 0x10),(string *)local_b8);
    bVar2 = isBool((QPDFObjectHandle *)(local_b8 + 0x10));
    bVar1 = true;
    if (bVar2) {
      getDict((QPDFObjectHandle *)local_d8);
      std::__cxx11::string::string<std::allocator<char>>(local_98,"/ImageMask",&local_dc);
      getKey((QPDFObjectHandle *)(local_d8 + 0x10),(string *)local_d8);
      bVar1 = getBoolValue((QPDFObjectHandle *)(local_d8 + 0x10));
      bVar1 = !bVar1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x18));
      std::__cxx11::string::~string(local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 0x18));
    std::__cxx11::string::~string(local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool
QPDFObjectHandle::isImage(bool exclude_imagemask) const
{
    return (
        isStreamOfType("", "/Image") &&
        ((!exclude_imagemask) ||
         (!(getDict().getKey("/ImageMask").isBool() &&
            getDict().getKey("/ImageMask").getBoolValue()))));
}